

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void rollback_prior_to_ops(bool walflush)

{
  fdb_status fVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  fdb_commit_opt_t opt;
  undefined7 in_register_00000039;
  ulong uVar6;
  fdb_doc **doc;
  int iVar7;
  fdb_kvs_handle *kv1;
  fdb_kvs_handle *mirror_kv1;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_iterator *it;
  int local_6c4;
  fdb_doc *vdoc;
  fdb_seqnum_t local_6b8;
  fdb_kvs_info info;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_doc *local_658 [100];
  char keybuf [256];
  fdb_config fconfig;
  char bodybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig.wal_threshold = 0x400;
  fconfig.seqtree_opt = '\x01';
  fconfig.purging_interval = 1;
  fconfig.compaction_threshold = '\n';
  fconfig.flags = fconfig.purging_interval;
  fdb_open(&dbfile,"./mvcc_test1",&fconfig);
  fdb_kvs_open(dbfile,&kv1,"kv1",&kvs_config);
  local_6c4 = (int)CONCAT71(in_register_00000039,walflush);
  if (local_6c4 == 0) {
    pcVar3 = "mirror";
  }
  else {
    pcVar3 = (char *)0x0;
  }
  fdb_kvs_open(dbfile,&mirror_kv1,pcVar3,&kvs_config);
  lVar4 = 0;
  for (uVar6 = 0; uVar6 != 100; uVar6 = uVar6 + 1) {
    sprintf(keybuf,"key%d",uVar6 & 0xffffffff);
    sVar2 = strlen(keybuf);
    fdb_doc_create((fdb_doc **)((long)local_658 + lVar4),keybuf,sVar2,(void *)0x0,0,(void *)0x0,0);
    fdb_set(kv1,local_658[uVar6]);
    fdb_set(mirror_kv1,local_658[uVar6]);
    lVar4 = lVar4 + 8;
  }
  fdb_commit(dbfile,'\0');
  for (lVar4 = 0; lVar4 != 0x32; lVar4 = lVar4 + 1) {
    fdb_del(kv1,local_658[lVar4]);
    fdb_del(mirror_kv1,local_658[lVar4]);
    fdb_doc_free(local_658[lVar4]);
  }
  for (lVar4 = 0; lVar4 != 0x32; lVar4 = lVar4 + 1) {
    fdb_doc_free(local_658[lVar4 + 0x32]);
  }
  fdb_commit(dbfile,'\0');
  fdb_get_kvs_info(kv1,&info);
  if (info.doc_count != 0x32) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
           );
    rollback_prior_to_ops(bool)::__test_pass = '\x01';
    if (info.doc_count != 0x32) {
      __assert_fail("info.doc_count == (size_t)expected_doc_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xf0b,"void rollback_prior_to_ops(bool)");
    }
  }
  local_6b8 = info.last_seqnum;
  for (iVar7 = 0; iVar7 != 100; iVar7 = iVar7 + 1) {
    iVar5 = 100;
    for (lVar4 = 0; lVar4 != 800; lVar4 = lVar4 + 8) {
      sprintf(keybuf,"key%d",iVar5);
      doc = (fdb_doc **)((long)local_658 + lVar4);
      sVar2 = strlen(keybuf);
      fdb_doc_create(doc,keybuf,sVar2,(void *)0x0,0,(void *)0x0,0);
      fdb_set(kv1,*doc);
      fdb_del(kv1,*doc);
      fdb_doc_free(*doc);
      iVar5 = iVar5 + 1;
    }
  }
  opt = (fdb_commit_opt_t)local_6c4;
  fdb_commit(dbfile,opt);
  fVar1 = fdb_rollback(&kv1,(long)(int)local_6b8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xf25);
    rollback_prior_to_ops(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xf25,"void rollback_prior_to_ops(bool)");
  }
  fdb_get_kvs_info(kv1,&info);
  if (info.doc_count != 0x32) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
           );
    rollback_prior_to_ops(bool)::__test_pass = '\x01';
    if (info.doc_count != 0x32) {
      __assert_fail("info.doc_count == (size_t)expected_doc_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xf28,"void rollback_prior_to_ops(bool)");
    }
  }
  fdb_get_kvs_info(mirror_kv1,&info);
  if (info.doc_count != 0x32) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
           );
    rollback_prior_to_ops(bool)::__test_pass = '\x01';
    if (info.doc_count != 0x32) {
      __assert_fail("info.doc_count == (size_t)expected_doc_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xf2a,"void rollback_prior_to_ops(bool)");
    }
  }
  fVar1 = fdb_iterator_sequence_init(mirror_kv1,&it,0,0,0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    do {
      fVar1 = fdb_iterator_get_metaonly(it,&rdoc);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xf30);
        rollback_prior_to_ops(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xf30,"void rollback_prior_to_ops(bool)");
      }
      fdb_doc_create(&vdoc,rdoc->key,rdoc->keylen,rdoc->meta,rdoc->metalen,rdoc->body,rdoc->bodylen)
      ;
      fVar1 = fdb_get(kv1,vdoc);
      if (rdoc->deleted == true) {
        if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xf37);
          rollback_prior_to_ops(bool)::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xf37,"void rollback_prior_to_ops(bool)");
        }
      }
      else if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xf39);
        rollback_prior_to_ops(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xf39,"void rollback_prior_to_ops(bool)");
      }
      fdb_doc_free(rdoc);
      rdoc = (fdb_doc *)0x0;
      fdb_doc_free(vdoc);
      fVar1 = fdb_iterator_next(it);
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);
    fdb_kvs_close(mirror_kv1);
    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    pcVar3 = "normal commit:";
    if (opt != '\0') {
      pcVar3 = "commit with wal flush:";
    }
    sprintf(bodybuf,"rollback prior to ops test %s",pcVar3);
    pcVar3 = "%s PASSED\n";
    if (rollback_prior_to_ops(bool)::__test_pass != '\0') {
      pcVar3 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar3,bodybuf);
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0xf2d);
  rollback_prior_to_ops(bool)::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xf2d,"void rollback_prior_to_ops(bool)");
}

Assistant:

void rollback_prior_to_ops(bool walflush)
{

    TEST_INIT();
    memleak_start();

    int r;
    int i, j, n=100;
    int expected_doc_count = 0;
    int rb_seqnum;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_iterator *it;
    fdb_kvs_handle *kv1, *mirror_kv1;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL, *vdoc;
    fdb_status status;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 10;
    fconfig.purging_interval = 1; // retain deletes until compaction

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);

    if(walflush){
        fdb_kvs_open(dbfile, &mirror_kv1, NULL, &kvs_config);
    } else {
        fdb_kvs_open(dbfile, &mirror_kv1, "mirror", &kvs_config);
    }

    // set n docs
    for(i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, NULL, 0);
        fdb_set(kv1, doc[i]);
        fdb_set(mirror_kv1, doc[i]);
        expected_doc_count++;
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // delete subset of recently loaded docs
    for(i=0;i<n/2;++i){
        fdb_del(kv1, doc[i]);
        fdb_del(mirror_kv1, doc[i]);
        expected_doc_count--;
        fdb_doc_free(doc[i]);
    }

    for(i=n/2;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // commit and save seqnum
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_get_kvs_info(kv1, &info);
    TEST_CHK(info.doc_count == (size_t)expected_doc_count);
    rb_seqnum = info.last_seqnum;

    for (j=0;j<100;++j){
        // load some more docs but stop mirroring
        for(i=0;i<n;++i){
            sprintf(keybuf, "key%d", n+i);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                NULL, 0, NULL, 0);
            fdb_set(kv1, doc[i]);
            if( n%2 == 0){
                fdb_del(kv1, doc[i]);
            }
            fdb_doc_free(doc[i]);
        }
    }

    // commit wal or normal
    if(walflush){
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    } else {
        fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    }

    // rollback
    status = fdb_rollback(&kv1, rb_seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_get_kvs_info(kv1, &info);
    TEST_CHK(info.doc_count == (size_t)expected_doc_count);
    fdb_get_kvs_info(mirror_kv1, &info);
    TEST_CHK(info.doc_count == (size_t)expected_doc_count);

    status = fdb_iterator_sequence_init(mirror_kv1, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get_metaonly(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_doc_create(&vdoc, rdoc->key, rdoc->keylen,
                              rdoc->meta, rdoc->metalen,
                              rdoc->body, rdoc->bodylen);
        status = fdb_get(kv1, vdoc);
        if (rdoc->deleted){
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        } else {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
        fdb_doc_free(vdoc);
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(it);
    fdb_kvs_close(mirror_kv1);
    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    sprintf(bodybuf, "rollback prior to ops test %s",
            walflush ? "commit with wal flush:" : "normal commit:");
    TEST_RESULT(bodybuf);
}